

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * arrayClosure(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *extraout_RAX;
  double __x;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  treeNode *local_80;
  treeNode *p;
  string local_70;
  treeNode *local_50;
  treeNode *ret;
  allocator local_31;
  string local_30;
  treeNode *local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"{",&local_31);
  bVar1 = match(&local_30,Empty);
  std::__cxx11::string::~string((string *)&local_30);
  __x = (double)std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar1) {
    ptVar2 = (treeNode *)operator_new(0x58);
    p._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"sequence",(allocator *)((long)&p + 7));
    treeNode::treeNode(ptVar2,declareStmt,&local_70);
    p._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
    local_50 = ptVar2;
    ptVar2 = arrayClosure();
    local_50->child[0] = ptVar2;
    local_80 = local_50->child[0];
    while( true ) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,",",&local_a1);
      bVar1 = match(&local_a0,Empty);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      if (!bVar1) break;
      ptVar2 = arrayClosure();
      local_80->sibling = ptVar2;
      local_80 = local_80->sibling;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"}",&local_c9);
    match(&local_c8,lackRightBucket);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_10 = local_50;
  }
  else {
    exp(__x);
    local_10 = extraout_RAX;
  }
  return local_10;
}

Assistant:

treeNode* arrayClosure()
{
    if(match("{"))
    {
        auto ret = new treeNode(StmtKind::declareStmt,"sequence");
        ret->child[0]=arrayClosure();
        auto p=ret->child[0];
        while(match(","))
        {
            p->sibling=arrayClosure();
            p=p->sibling;
        }
        match("}",Error::lackRightBucket);
        return ret;
    }
    else
    {
        return exp();
    }
}